

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

ecs_entity_t find_as_alias(ecs_world_t *world,char *name)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = ecs_vector_count(world->aliases);
  pvVar4 = _ecs_vector_first(world->aliases,0x10,0x10);
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    if (uVar6 * 0x10 + 0x10 == lVar5 + 0x10) {
      return 0;
    }
    iVar3 = strcmp(*(char **)((long)pvVar4 + lVar5),name);
    lVar1 = lVar5 + 0x10;
  } while (iVar3 != 0);
  return *(ecs_entity_t *)((long)pvVar4 + lVar5 + 8);
}

Assistant:

static
ecs_entity_t find_as_alias(
    ecs_world_t *world,
    const char *name)
{
    int32_t i, count = ecs_vector_count(world->aliases);
    ecs_alias_t *aliases = ecs_vector_first(world->aliases, ecs_alias_t);
    for (i = 0; i < count; i ++) {
        if (!strcmp(aliases[i].name, name)) {
            return aliases[i].entity;
        }
    }

    return 0;
}